

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O2

pair<const_S,_bool> * __thiscall
frozen::bits::LowerBound<int,frozen::impl::CompareKey<std::less<void>>>::
doitfirst<std::pair<S_const,bool>const*,4ul>
          (LowerBound<int,frozen::impl::CompareKey<std::less<void>>> *this,int *first)

{
  int iVar1;
  
  iVar1 = **(int **)this;
  if (first[2] < iVar1) {
    if (iVar1 <= first[4]) {
      return (pair<const_S,_bool> *)(first + 4);
    }
    first = first + 6;
  }
  return (pair<const_S,_bool> *)(first + (ulong)(*first < iVar1) * 2);
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }